

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O2

int run_test_poll_oob(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int *piVar3;
  undefined8 uVar4;
  char *pcVar5;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(puVar2,&server_handle);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_init(puVar2,&client_handle);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_init(puVar2,&peer_handle);
        if (iVar1 == 0) {
          iVar1 = uv_idle_init(puVar2,&idle);
          if (iVar1 == 0) {
            iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&addr,0);
            if (iVar1 == 0) {
              iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
              if (iVar1 == 0) {
                iVar1 = uv_tcp_nodelay(&client_handle,1);
                if (iVar1 == 0) {
                  client_fd = socket(2,1,0);
                  if (client_fd < 0) {
                    pcVar5 = "client_fd >= 0";
                    uVar4 = 0xb6;
                  }
                  else {
                    piVar3 = __errno_location();
                    do {
                      *piVar3 = 0;
                      iVar1 = connect(client_fd,(sockaddr *)&addr,0x10);
                      if (iVar1 != -1) {
                        if (iVar1 == 0) {
                          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                          if (iVar1 == 0) {
                            if (ticks == 10) {
                              if (cli_pr_check == '\0') {
                                pcVar5 = "cli_pr_check == 1";
                                uVar4 = 0xc2;
                              }
                              else if (cli_rd_check == 2) {
                                if (srv_rd_check == '\0') {
                                  pcVar5 = "srv_rd_check == 1";
                                  uVar4 = 200;
                                }
                                else {
                                  puVar2 = uv_default_loop();
                                  uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                  uv_run(puVar2,UV_RUN_DEFAULT);
                                  puVar2 = uv_default_loop();
                                  iVar1 = uv_loop_close(puVar2);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                  pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                                  uVar4 = 0xca;
                                }
                              }
                              else {
                                pcVar5 = "cli_rd_check == 2";
                                uVar4 = 0xc4;
                              }
                            }
                            else {
                              pcVar5 = "ticks == kMaxTicks";
                              uVar4 = 0xbf;
                            }
                          }
                          else {
                            pcVar5 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                            uVar4 = 0xbd;
                          }
                          goto LAB_00140572;
                        }
                        break;
                      }
                    } while (*piVar3 == 4);
                    pcVar5 = "r == 0";
                    uVar4 = 0xbb;
                  }
                }
                else {
                  pcVar5 = "0 == uv_tcp_nodelay(&client_handle, 1)";
                  uVar4 = 0xb3;
                }
              }
              else {
                pcVar5 = "0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb)";
                uVar4 = 0xb0;
              }
            }
            else {
              pcVar5 = "0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)";
              uVar4 = 0xaf;
            }
          }
          else {
            pcVar5 = "0 == uv_idle_init(loop, &idle)";
            uVar4 = 0xae;
          }
        }
        else {
          pcVar5 = "0 == uv_tcp_init(loop, &peer_handle)";
          uVar4 = 0xad;
        }
      }
      else {
        pcVar5 = "0 == uv_tcp_init(loop, &client_handle)";
        uVar4 = 0xac;
      }
    }
    else {
      pcVar5 = "0 == uv_tcp_init(loop, &server_handle)";
      uVar4 = 0xab;
    }
  }
  else {
    pcVar5 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar4 = 0xa8;
  }
LAB_00140572:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll-oob.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT(client_fd >= 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT(r == 0);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT(cli_pr_check == 1);
  /* Did client receive the POLLIN message */
  ASSERT(cli_rd_check == 2);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT(srv_rd_check == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}